

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O3

QModelIndex * __thiscall
QColumnView::moveCursor
          (QModelIndex *__return_storage_ptr__,QColumnView *this,CursorAction cursorAction,
          KeyboardModifiers modifiers)

{
  char cVar1;
  LayoutDirection LVar2;
  QAbstractItemModel *pQVar3;
  long in_FS_OFFSET;
  QModelIndex local_90;
  undefined8 local_78;
  quintptr local_70;
  QAbstractItemModel *pQStack_68;
  int local_60;
  int local_5c;
  long local_50;
  QModelIndex local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = QAbstractItemView::model((QAbstractItemView *)this);
  if (pQVar3 == (QAbstractItemModel *)0x0) {
    __return_storage_ptr__->r = -1;
    __return_storage_ptr__->c = -1;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __return_storage_ptr__->i = 0;
      (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
      return __return_storage_ptr__;
    }
    goto LAB_00561856;
  }
  local_48.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::currentIndex(&local_48,(QAbstractItemView *)this);
  LVar2 = QWidget::layoutDirection((QWidget *)this);
  if (LVar2 == RightToLeft) {
    if (cursorAction == MoveLeft) {
LAB_00561747:
      pQVar3 = QAbstractItemView::model((QAbstractItemView *)this);
      cVar1 = (**(code **)(*(long *)pQVar3 + 0x88))(pQVar3,&local_48);
      if (cVar1 == '\0') {
        if (local_48.m.ptr == (QAbstractItemModel *)0x0) goto LAB_00561817;
        (**(code **)(*(long *)local_48.m.ptr + 0x70))
                  (__return_storage_ptr__,local_48.m.ptr,local_48.r + 1,local_48.c);
      }
      else {
        pQVar3 = QAbstractItemView::model((QAbstractItemView *)this);
        (**(code **)(*(long *)pQVar3 + 0x60))(__return_storage_ptr__,pQVar3,0,0,&local_48);
      }
    }
    else {
      if (cursorAction != MoveRight) goto LAB_00561817;
LAB_005616e9:
      if ((((local_48.m.ptr != (QAbstractItemModel *)0x0) &&
           ((**(code **)(*(long *)local_48.m.ptr + 0x68))(&local_60,local_48.m.ptr,&local_48),
           -1 < local_60)) && (-1 < local_5c)) && (local_50 != 0)) {
        if (local_48.m.ptr == (QAbstractItemModel *)0x0) {
          local_78 = 0xffffffffffffffff;
          local_70 = 0;
          pQStack_68 = (QAbstractItemModel *)0x0;
        }
        else {
          (**(code **)(*(long *)local_48.m.ptr + 0x68))(&local_78,local_48.m.ptr,&local_48);
        }
        QAbstractItemView::rootIndex(&local_90,(QAbstractItemView *)this);
        if ((((int)local_78 != local_90.r) || (local_78._4_4_ != local_90.c)) ||
           ((local_70 != local_90.i || (pQStack_68 != local_90.m.ptr)))) {
          if (local_48.m.ptr == (QAbstractItemModel *)0x0) goto LAB_00561817;
          (**(code **)(*(long *)local_48.m.ptr + 0x68))
                    (__return_storage_ptr__,local_48.m.ptr,&local_48);
          goto LAB_00561838;
        }
      }
      (__return_storage_ptr__->m).ptr = local_48.m.ptr;
      __return_storage_ptr__->r = local_48.r;
      __return_storage_ptr__->c = local_48.c;
      __return_storage_ptr__->i = local_48.i;
    }
  }
  else {
    if (cursorAction == MoveRight) goto LAB_00561747;
    if (cursorAction == MoveLeft) goto LAB_005616e9;
LAB_00561817:
    __return_storage_ptr__->r = -1;
    __return_storage_ptr__->c = -1;
    __return_storage_ptr__->i = 0;
    (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
  }
LAB_00561838:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
LAB_00561856:
  __stack_chk_fail();
}

Assistant:

QModelIndex QColumnView::moveCursor(CursorAction cursorAction, Qt::KeyboardModifiers modifiers)
{
    // the child views which have focus get to deal with this first and if
    // they don't accept it then it comes up this view and we only grip left/right
    Q_UNUSED(modifiers);
    if (!model())
        return QModelIndex();

    QModelIndex current = currentIndex();
    if (isRightToLeft()) {
        if (cursorAction == MoveLeft)
            cursorAction = MoveRight;
        else if (cursorAction == MoveRight)
            cursorAction = MoveLeft;
    }
    switch (cursorAction) {
    case MoveLeft:
        if (current.parent().isValid() && current.parent() != rootIndex())
            return (current.parent());
        else
            return current;

    case MoveRight:
        if (model()->hasChildren(current))
            return model()->index(0, 0, current);
        else
            return current.sibling(current.row() + 1, current.column());

    default:
        break;
    }

    return QModelIndex();
}